

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall unitOps_inequality1_Test::TestBody(unitOps_inequality1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_a0;
  Message local_98;
  int local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70 [3];
  int local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  unit u3;
  unit u2;
  unit u1;
  double diff;
  double start;
  int eqFailNeg;
  int eqFailPos;
  unitOps_inequality1_Test *this_local;
  
  start._4_4_ = 0;
  start._0_4_ = 0;
  _eqFailNeg = this;
  for (diff = 1.0; diff < 1.000002; diff = diff + 1e-09) {
    u1.multiplier_ = -1.3686737e-33;
    u1.base_units_ = (unit_data)0x3ee4f8b5;
    for (; 2.501e-06 < (double)u1; u1 = (unit)((double)u1 - 1e-08)) {
      units::unit::unit(&u2,diff,(unit *)&units::V);
      units::unit::unit(&u3,diff + (double)u1,(unit *)&units::V);
      units::unit::unit((unit *)&gtest_ar.message_,diff - (double)u1,(unit *)&units::V);
      bVar1 = units::unit::operator==(&u2,&u3);
      if (bVar1) {
        start._4_4_ = start._4_4_ + 1;
      }
      bVar1 = units::unit::operator==(&u2,(unit *)&gtest_ar.message_);
      if (bVar1) {
        start._0_4_ = start._0_4_ + 1;
      }
    }
  }
  local_54 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_50,"eqFailPos","0",(int *)((long)&start + 4),&local_54);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x1a6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_8c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_88,"eqFailNeg","0",(int *)&start,&local_8c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x1a7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  return;
}

Assistant:

TEST(unitOps, inequality1)
{
    int eqFailPos = 0;
    int eqFailNeg = 0;
    double start = 1.0;
    while (start < (1.0 + 2e-6)) {
        double diff = 1e-5;
        while (diff > 2.501e-6) {
            auto u1 = unit(start, V);
            auto u2 = unit(start + diff, V);
            auto u3 = unit(start - diff, V);
            if (u1 == u2) {
                ++eqFailPos;
            }
            if (u1 == u3) {
                ++eqFailNeg;
            }
            diff -= 1e-8;
        }
        start += 1e-9;
    }
    EXPECT_EQ(eqFailPos, 0);
    EXPECT_EQ(eqFailNeg, 0);
}